

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O2

void Saig_SynchInitPisGiven(Aig_Man_t *pAig,Vec_Ptr_t *vSimInfo,int nWords,char *pValues)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = 0;
  uVar4 = (ulong)(uint)nWords;
  if (nWords < 1) {
    uVar4 = uVar3;
  }
  for (; (long)uVar3 < (long)pAig->nTruePis; uVar3 = uVar3 + 1) {
    pvVar2 = Vec_PtrEntry(pAig->vCis,(int)uVar3);
    pvVar2 = Vec_PtrEntry(vSimInfo,*(int *)((long)pvVar2 + 0x24));
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      uVar1 = Saig_SynchTernary((int)pValues[uVar3]);
      *(uint *)((long)pvVar2 + uVar5 * 4) = uVar1;
    }
  }
  return;
}

Assistant:

void Saig_SynchInitPisGiven( Aig_Man_t * pAig, Vec_Ptr_t * vSimInfo, int nWords, char * pValues )
{
    Aig_Obj_t * pObj;
    unsigned * pSim;
    int i, w;
    Saig_ManForEachPi( pAig, pObj, i )
    {
        pSim = (unsigned *)Vec_PtrEntry( vSimInfo, pObj->Id );
        for ( w = 0; w < nWords; w++ )
            pSim[w] = Saig_SynchTernary( pValues[i] );
    }
}